

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr_cache.hpp
# Opt level: O0

size_t __thiscall
cappuccino::rr_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::
erase_range<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (rr_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *key_range)

{
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> lVar1;
  bool bVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_68 [3];
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_50;
  iterator keyed_position;
  unsigned_long *key;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> guard;
  size_t deleted_elements;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *key_range_local;
  rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  guard._M_device = (mutex_type *)0x0;
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> *)&__range3,
             (mutex_type *)this);
  __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(key_range);
  key = (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(key_range);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)&key), lVar1 = guard, bVar2) {
    keyed_position.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end0);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::find((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 *)(this + 0x40),
                (key_type *)
                keyed_position.
                super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                _M_cur);
    local_68[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                *)(this + 0x40));
    bVar2 = std::__detail::operator!=(&local_50,local_68);
    if (bVar2) {
      guard._M_device =
           (mutex_type *)((long)&((guard._M_device)->m_lock).super___mutex_base._M_mutex + 1);
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>
                           *)&local_50);
      rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
      ::do_erase((rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                  *)this,ppVar3->second);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end0);
  }
  std::lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_>::~lock_guard
            ((lock_guard<cappuccino::mutex<(cappuccino::thread_safe)1,_std::mutex>_> *)&__range3);
  return (size_t)lVar1._M_device;
}

Assistant:

auto erase_range(const range_type& key_range) -> size_t
    {
        size_t deleted_elements{0};

        std::lock_guard guard{m_lock};
        for (auto& key : key_range)
        {
            auto keyed_position = m_keyed_elements.find(key);
            if (keyed_position != m_keyed_elements.end())
            {
                ++deleted_elements;
                do_erase(keyed_position->second);
            }
        }

        return deleted_elements;
    }